

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void concept_suite::random_access_iterator_addition(void)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> data;
  undefined4 local_3c;
  vector<int,_std::allocator<int>_> local_38;
  int local_20 [4];
  
  local_20[0] = 0xb;
  local_20[1] = 0x16;
  local_20[2] = 0x21;
  local_20[3] = 0x2c;
  __l._M_len = 4;
  __l._M_array = local_20;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,__l,(allocator_type *)&local_3c);
  local_20[0] = 2;
  local_20[1] = 0;
  local_3c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), a)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xbb,"void concept_suite::random_access_iterator_addition()",local_20,
             (allocator_type *)&local_3c);
  local_20[0] = 2;
  local_20[1] = 0;
  local_3c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), b)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xbe,"void concept_suite::random_access_iterator_addition()",local_20,
             (allocator_type *)&local_3c);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void random_access_iterator_addition()
{
    // a + n
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.begin() + 2;
    BOOST_TEST_EQ(std::distance(span.begin(), a), 2);
    // n + a
    circular_view<int>::iterator b = 2 + span.begin();
    BOOST_TEST_EQ(std::distance(span.begin(), b), 2);
}